

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

void __thiscall PlayerStrategy::~PlayerStrategy(PlayerStrategy *this)

{
  Country *pCVar1;
  string *psVar2;
  pointer pcVar3;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013e8c8;
  pCVar1 = this->from;
  if (pCVar1 != (Country *)0x0) {
    Map::Country::~Country(pCVar1);
  }
  operator_delete(pCVar1,0x30);
  pCVar1 = this->to;
  if (pCVar1 != (Country *)0x0) {
    Map::Country::~Country(pCVar1);
  }
  operator_delete(pCVar1,0x30);
  operator_delete(this->armiesToPlace,4);
  operator_delete(this->exchangingCardType,4);
  operator_delete(this->numWeakest,4);
  psVar2 = this->strategyName;
  if (psVar2 != (string *)0x0) {
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &psVar2->field_2) {
      operator_delete(pcVar3,(psVar2->field_2)._M_allocated_capacity + 1);
    }
  }
  operator_delete(psVar2,0x20);
  this->player = (Player *)0x0;
  return;
}

Assistant:

PlayerStrategy::~PlayerStrategy() {
    delete from;
    delete to;
    delete armiesToPlace;
    delete exchangingCardType;
    delete numWeakest;
    delete strategyName;
    // makes sure the player is not deleted when switching strategies
    player = nullptr;
    delete player;
}